

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O2

int write_str(BIO *bp,char *str)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int len;
  
  sVar3 = strlen(str);
  if ((sVar3 & 0xffffffff80000000) == 0) {
    len = (int)sVar3;
    iVar1 = BIO_write((BIO *)bp,str,len);
    iVar2 = -1;
    if (iVar1 == len) {
      iVar2 = len;
    }
  }
  else {
    ERR_put_error(0xc,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                  ,0x3b);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int write_str(BIO *bp, const char *str) {
  size_t len = strlen(str);
  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return -1;
  }
  return BIO_write(bp, str, (int)len) == (int)len ? (int)len : -1;
}